

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_palette.c
# Opt level: O0

bool_t prf_vertex_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  bfile_t *bfile_00;
  prf_nodeinfo_t *ppVar4;
  bfile_t *bfile_01;
  bfile_t *in_RDX;
  prf_state_t *in_RSI;
  ushort *in_RDI;
  prf_nodeinfo_t *nodeinfo_1;
  uint16_t *uint16ptr_1;
  int count_1;
  int i_1;
  prf_nodeinfo_t *nodeinfo;
  uint16_t *uint16ptr;
  int count;
  int i;
  uint32_t curptr;
  prf_node_t *subnode;
  int32_t length;
  node_data_conflict12 *vpdata;
  prf_nodeinfo_t *in_stack_ffffffffffffff98;
  bfile_t *in_stack_ffffffffffffffa0;
  int local_54;
  uint in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  uint uVar5;
  
  puVar1 = *(uint **)(in_RDI + 4);
  if (in_RSI->model->vertextras != (prf_vertex_pool_s **)0x0) {
    in_stack_ffffffffffffffc4 = prf_array_count((void *)0x110b5c);
    for (in_stack_ffffffffffffffc8 = 0; in_stack_ffffffffffffffc8 < (int)in_stack_ffffffffffffffc4;
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
    }
  }
  bf_put_uint16_be(in_stack_ffffffffffffffa0,(uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30));
  bf_put_int16_be(in_stack_ffffffffffffffa0,(int16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30));
  bf_put_int32_be(in_stack_ffffffffffffffa0,(int32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  bfile_00 = (bfile_t *)prf_node_create();
  for (uVar5 = 8; uVar5 < *puVar1; uVar5 = *(ushort *)&bfile_00->field_0x2 + uVar5) {
    lVar2 = *(long *)(in_RDI + 4);
    bfile_00->flags = *(uint16_t *)(lVar2 + (ulong)uVar5);
    *(uint16_t *)&bfile_00->field_0x2 = ((uint16_t *)(lVar2 + (ulong)uVar5))[1];
    bfile_00->file = (FILE *)(*(long *)(in_RDI + 4) + (ulong)uVar5 + 4);
    if (*(uint16_t *)&bfile_00->field_0x2 == 4) {
      bfile_00->file = (FILE *)0x0;
    }
    ppVar4 = prf_nodeinfo_get((uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30));
    if ((ppVar4 == (prf_nodeinfo_t *)0x0) ||
       (ppVar4->save_f == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
      prf_debug(6,"saving node of type %d",(ulong)*in_RDI);
      bf_put_uint16_be(in_stack_ffffffffffffffa0,
                       (uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30));
      bf_put_uint16_be(in_stack_ffffffffffffffa0,
                       (uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30));
      if (4 < *(ushort *)&bfile_00->field_0x2) {
        bf_write(bfile_00,(uint8_t *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc4);
      }
    }
    else {
      (*ppVar4->save_f)((prf_node_t *)bfile_00,in_RSI,in_RDX);
    }
  }
  if (in_RSI->model->vertextras != (prf_vertex_pool_s **)0x0) {
    iVar3 = prf_array_count((void *)0x110d51);
    for (local_54 = 0; local_54 < iVar3; local_54 = local_54 + 1) {
      for (uVar5 = 0; uVar5 < in_RSI->model->vertextras[local_54]->position;
          uVar5 = *(ushort *)&bfile_00->field_0x2 + uVar5) {
        bfile_01 = (bfile_t *)(in_RSI->model->vertextras[local_54]->data + uVar5);
        bfile_00->flags = bfile_01->flags;
        *(uint16_t *)&bfile_00->field_0x2 = *(uint16_t *)&bfile_01->field_0x2;
        bfile_00->file = (FILE *)(in_RSI->model->vertextras[local_54]->data + (ulong)uVar5 + 4);
        if (*(uint16_t *)&bfile_00->field_0x2 == 4) {
          bfile_00->file = (FILE *)0x0;
        }
        in_stack_ffffffffffffff98 =
             prf_nodeinfo_get((uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30));
        if ((in_stack_ffffffffffffff98 == (prf_nodeinfo_t *)0x0) ||
           (in_stack_ffffffffffffff98->save_f ==
            (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
          prf_debug(6,"saving extra node of type %d",(ulong)*in_RDI);
          bf_put_uint16_be(bfile_01,(uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30));
          bf_put_uint16_be(bfile_01,(uint16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30));
          if (4 < *(ushort *)&bfile_00->field_0x2) {
            bf_write(bfile_00,(uint8_t *)CONCAT44(uVar5,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc4);
          }
        }
        else {
          (*in_stack_ffffffffffffff98->save_f)((prf_node_t *)bfile_00,in_RSI,in_RDX);
        }
      }
    }
  }
  bfile_00->file = (FILE *)0x0;
  prf_node_destroy((prf_node_t *)0x110f10);
  return 1;
}

Assistant:

static
bool_t
prf_vertex_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    node_data * vpdata;
    int32_t length;
    prf_node_t * subnode;
    uint32_t curptr;

    assert( node != NULL && state != NULL && bfile != NULL );

    vpdata = (node_data *) node->data;
    length = vpdata->length;

    if ( state->model->vertextras != NULL ) {
        int i, count;
        count = prf_array_count( state->model->vertextras );
        for ( i = 0; i < count; i++ ) 
            length += state->model->vertextras[i]->position;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_int16_be( bfile, node->length );
    bf_put_int32_be( bfile, length );

    subnode = prf_node_create();
    curptr = 8;
    while ( curptr < (uint32_t) vpdata->length ) {
        uint16_t * uint16ptr;
        prf_nodeinfo_t * nodeinfo;

        uint16ptr = (uint16_t *) (node->data + curptr);
        subnode->opcode = uint16ptr[0];
        subnode->length = uint16ptr[1];
        subnode->data = node->data + curptr + 4;
        if ( subnode->length == 4 )
            subnode->data = NULL;
        nodeinfo = prf_nodeinfo_get( subnode->opcode );
        if ( nodeinfo != NULL && nodeinfo->save_f != NULL ) {
            (*(nodeinfo->save_f))( subnode, state, bfile );
        } else {
            prf_debug( 6, "saving node of type %d", node->opcode );
            bf_put_uint16_be( bfile, subnode->opcode );
            bf_put_uint16_be( bfile, subnode->length );
            if ( subnode->length > 4 )
                bf_write( bfile, subnode->data, subnode->length - 4 );
        }
        curptr += subnode->length;
    }

    if ( state->model->vertextras != NULL ) {
        int i, count;
        count = prf_array_count( state->model->vertextras );
        for ( i = 0; i < count; i++ ) {
            curptr = 0;
            while ( curptr < state->model->vertextras[i]->position ) {
                uint16_t * uint16ptr;
		prf_nodeinfo_t * nodeinfo;

		uint16ptr = (uint16_t *)
                    (state->model->vertextras[i]->data + curptr);
		subnode->opcode = uint16ptr[0];
		subnode->length = uint16ptr[1];
                subnode->data = state->model->vertextras[i]->data + curptr + 4;
                if ( subnode->length == 4 )
                    subnode->data = NULL;
		nodeinfo = prf_nodeinfo_get( subnode->opcode );
                if ( nodeinfo != NULL && nodeinfo->save_f != NULL ) {
                    (*(nodeinfo->save_f))( subnode, state, bfile );
                } else {
                    prf_debug( 6, "saving extra node of type %d", node->opcode );
                    bf_put_uint16_be( bfile, subnode->opcode );
                    bf_put_uint16_be( bfile, subnode->length );
                    if ( subnode->length > 4 )
                        bf_write( bfile, subnode->data, subnode->length - 4 );
                }
                curptr += subnode->length;
            }
        }
    }

    subnode->data = NULL;
    prf_node_destroy( subnode );

    return TRUE;
}